

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

align fmt::v11::detail::parse_align(char c)

{
  char c_local;
  undefined4 local_4;
  
  if (c == '<') {
    local_4 = left;
  }
  else if (c == '>') {
    local_4 = right;
  }
  else if (c == '^') {
    local_4 = center;
  }
  else {
    local_4 = none;
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR inline auto parse_align(char c) -> align {
  switch (c) {
  case '<': return align::left;
  case '>': return align::right;
  case '^': return align::center;
  }
  return align::none;
}